

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

void __thiscall pstore::index::details::linear_node::linear_node(linear_node *this,linear_node *rhs)

{
  *(undefined8 *)(this->signature_)._M_elems = 0x72656e4c78646e49;
  this->size_ = rhs->size_;
  this->leaves_[0].a_ = 0;
  if (rhs->size_ != 0) {
    memmove(this->leaves_,rhs->leaves_,rhs->size_ << 3);
    return;
  }
  return;
}

Assistant:

linear_node::linear_node (linear_node const & rhs)
                    : size_{rhs.size ()} {

                std::copy (rhs.begin (), rhs.end (), &leaves_[0]);
            }